

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  float fVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  JSValueUnion JVar12;
  JSValueUnion JVar13;
  uint uVar14;
  long lVar15;
  int64_t iVar16;
  bool bVar17;
  double dVar18;
  float fVar19;
  JSValue JVar20;
  int local_40;
  int local_3c;
  double local_38;
  
  JVar13 = this_val.u;
  local_3c = special;
  iVar3 = js_typed_array_get_length_internal(ctx,this_val);
  iVar16 = 6;
  if (iVar3 < 0) {
LAB_0016b64e:
    JVar12.float64 = 0.0;
    goto LAB_0016baa2;
  }
  uVar14 = 0xffffffff;
  if (iVar3 == 0) goto switchD_0016b79a_default;
  if (local_3c == 1) {
    iVar5 = iVar3 + -1;
    lVar15 = -1;
    iVar4 = -1;
    local_40 = iVar5;
    if (argc < 2) goto LAB_0016b6a7;
    iVar4 = JS_ToFloat64(ctx,&local_38,argv[1]);
    if (iVar4 != 0) goto LAB_0016b64e;
    if (NAN(local_38)) {
      local_40 = 0;
LAB_0016b750:
      lVar15 = -1;
      iVar4 = -1;
      goto LAB_0016b6a7;
    }
    lVar15 = -1;
    if (0.0 <= local_38) {
      iVar4 = -1;
      if (local_38 < (double)iVar5) {
        local_40 = (int)local_38;
      }
      goto LAB_0016b6a7;
    }
    uVar6 = 0xffffffff;
    if (0.0 <= local_38 + (double)iVar3) {
      local_40 = (int)(local_38 + (double)iVar3);
      goto LAB_0016b750;
    }
    goto LAB_0016ba8c;
  }
  local_40 = 0;
  lVar15 = 1;
  iVar4 = iVar3;
  if (1 < argc) {
    JVar12.float64 = 0.0;
    iVar5 = JS_ToInt32Clamp(ctx,&local_40,argv[1],0,iVar3,iVar3);
    lVar15 = 1;
    if (iVar5 != 0) goto LAB_0016baa2;
  }
LAB_0016b6a7:
  uVar14 = 0xffffffff;
  if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar13.ptr + 0x30) + 0x18) + 0x30) + 4) != '\0')
  {
    uVar6 = 0xffffffff;
    if (local_3c != -1) goto LAB_0016ba8c;
    uVar14 = -(uint)((int)argv->tag != 3);
    goto LAB_0016ba93;
  }
  iVar5 = (int)argv->tag;
  if (iVar5 == 7) {
    dVar18 = (argv->u).float64;
    uVar7 = (ulong)dVar18;
    bVar9 = (double)(long)uVar7 == dVar18;
  }
  else {
    if (iVar5 != 0) goto switchD_0016b79a_default;
    uVar7 = (ulong)(argv->u).int32;
    dVar18 = (double)(argv->u).int32;
    bVar9 = true;
  }
  uVar6 = (uint)uVar7;
  switch(*(undefined2 *)((long)JVar13.ptr + 6)) {
  case 0x15:
  case 0x17:
    bVar17 = uVar7 < 0x100;
    goto joined_r0x0016b7f0;
  case 0x16:
    bVar17 = (long)(char)uVar7 == uVar7;
joined_r0x0016b7f0:
    if ((bool)(bVar9 & bVar17)) {
      lVar11 = *(long *)((long)JVar13.ptr + 0x38);
      if (local_3c == 1) {
        if (local_40 != iVar4) {
          lVar10 = 0;
          do {
            if ((uVar6 & 0xffff) == (uint)*(byte *)(lVar11 + local_40 + lVar10)) {
              iVar3 = (int)lVar10;
              goto LAB_0016b9d6;
            }
            lVar10 = lVar10 + lVar15;
          } while ((local_40 - iVar4) + (int)lVar10 != 0);
        }
      }
      else {
        pvVar8 = memchr((void *)(lVar11 + local_40),uVar6 & 0xffff,(long)iVar3 - (long)local_40);
        uVar14 = 0xffffffff;
        if (pvVar8 != (void *)0x0) {
          uVar14 = (int)pvVar8 - (int)lVar11;
        }
      }
    }
    break;
  case 0x18:
    bVar17 = (long)(short)uVar7 == uVar7;
    goto joined_r0x0016b7dd;
  case 0x19:
    bVar17 = uVar7 < 0x10000;
joined_r0x0016b7dd:
    if (((bool)(bVar9 & bVar17)) && (local_40 != iVar4)) {
      lVar11 = 0;
      do {
        if (*(short *)(*(long *)((long)JVar13.ptr + 0x38) + (long)local_40 * 2 + lVar11 * 2) ==
            (short)uVar7) goto LAB_0016b9d0;
        lVar11 = lVar11 + lVar15;
      } while ((local_40 - iVar4) + (int)lVar11 != 0);
    }
    break;
  case 0x1a:
    bVar17 = (long)(int)uVar6 == uVar7;
    goto joined_r0x0016b917;
  case 0x1b:
    bVar17 = uVar7 >> 0x20 == 0;
joined_r0x0016b917:
    if (((bool)(bVar9 & bVar17)) && (local_40 != iVar4)) {
      lVar11 = 0;
      do {
        if (*(uint *)(*(long *)((long)JVar13.ptr + 0x38) + (long)local_40 * 4 + lVar11 * 4) == uVar6
           ) goto LAB_0016b9d0;
        lVar11 = lVar11 + lVar15;
      } while ((local_40 - iVar4) + (int)lVar11 != 0);
    }
    break;
  case 0x1c:
    if (NAN(dVar18)) {
      uVar6 = 0xffffffff;
      if (local_3c != -1) goto LAB_0016ba8c;
      if (local_40 != iVar4) {
        lVar11 = 0;
        do {
          if (NAN(*(float *)(*(long *)((long)JVar13.ptr + 0x38) + (long)local_40 * 4 + lVar11 * 4)))
          goto LAB_0016ba7d;
          lVar11 = lVar11 + lVar15;
        } while ((local_40 - iVar4) + (int)lVar11 != 0);
LAB_0016ba75:
        uVar14 = 0xffffffff;
      }
    }
    else {
      fVar19 = (float)dVar18;
      if (((dVar18 == (double)fVar19) && (!NAN(dVar18) && !NAN((double)fVar19))) &&
         (local_40 != iVar4)) {
        lVar11 = 0;
        do {
          fVar1 = *(float *)(*(long *)((long)JVar13.ptr + 0x38) + (long)local_40 * 4 + lVar11 * 4);
          if ((fVar1 == fVar19) && (!NAN(fVar1) && !NAN(fVar19))) goto LAB_0016ba7d;
          lVar11 = lVar11 + lVar15;
        } while ((local_40 - iVar4) + (int)lVar11 != 0);
      }
    }
    break;
  case 0x1d:
    if (NAN(dVar18)) {
      uVar6 = 0xffffffff;
      if (local_3c != -1) goto LAB_0016ba8c;
      if (local_40 != iVar4) {
        lVar11 = 0;
        do {
          if (NAN(*(double *)(*(long *)((long)JVar13.ptr + 0x38) + (long)local_40 * 8 + lVar11 * 8))
             ) goto LAB_0016ba7d;
          lVar11 = lVar11 + lVar15;
        } while ((local_40 - iVar4) + (int)lVar11 != 0);
        goto LAB_0016ba75;
      }
    }
    else if (local_40 != iVar4) {
      lVar11 = 0;
      do {
        dVar2 = *(double *)(*(long *)((long)JVar13.ptr + 0x38) + (long)local_40 * 8 + lVar11 * 8);
        if ((dVar2 == dVar18) && (!NAN(dVar2) && !NAN(dVar18))) goto LAB_0016ba7d;
        lVar11 = lVar11 + lVar15;
      } while ((local_40 - iVar4) + (int)lVar11 != 0);
    }
  }
  goto switchD_0016b79a_default;
LAB_0016ba7d:
  uVar14 = local_40 + (int)lVar11;
  goto switchD_0016b79a_default;
LAB_0016b9d0:
  iVar3 = (int)lVar11;
LAB_0016b9d6:
  uVar14 = local_40 + iVar3;
switchD_0016b79a_default:
  uVar6 = uVar14;
  if (local_3c == -1) {
LAB_0016ba93:
    JVar12._1_7_ = 0;
    JVar12.int32._0_1_ = -1 < (int)uVar14;
    iVar16 = 1;
  }
  else {
LAB_0016ba8c:
    JVar12._4_4_ = 0;
    JVar12.int32 = uVar6;
    iVar16 = 0;
  }
LAB_0016baa2:
  JVar20.tag = iVar16;
  JVar20.u.float64 = JVar12.float64;
  return JVar20;
}

Assistant:

static JSValue js_typed_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int special)
{
    JSObject *p;
    int len, tag, is_int, is_bigint, k, stop, inc, res = -1;
    int64_t v64;
    double d;
    float f;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;
    if (len == 0)
        goto done;

    if (special == special_lastIndexOf) {
        k = len - 1;
        if (argc > 1) {
            if (JS_ToFloat64(ctx, &d, argv[1]))
                goto exception;
            if (isnan(d)) {
                k = 0;
            } else {
                if (d >= 0) {
                    if (d < k) {
                        k = d;
                    }
                } else {
                    d += len;
                    if (d < 0)
                        goto done;
                    k = d;
                }
            }
        }
        stop = -1;
        inc = -1;
    } else {
        k = 0;
        if (argc > 1) {
            if (JS_ToInt32Clamp(ctx, &k, argv[1], 0, len, len))
                goto exception;
        }
        stop = len;
        inc = 1;
    }

    p = JS_VALUE_GET_OBJ(this_val);
    /* if the array was detached, no need to go further (but no
       exception is raised) */
    if (typed_array_is_detached(ctx, p)) {
        /* "includes" scans all the properties, so "undefined" can match */
        if (special == special_includes && JS_IsUndefined(argv[0]) && len > 0)
            res = 0;
        goto done;
    }
    
    is_bigint = 0;
    is_int = 0; /* avoid warning */
    v64 = 0; /* avoid warning */
    tag = JS_VALUE_GET_NORM_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        is_int = 1;
        v64 = JS_VALUE_GET_INT(argv[0]);
        d = v64;
    } else
    if (tag == JS_TAG_FLOAT64) {
        d = JS_VALUE_GET_FLOAT64(argv[0]);
        v64 = d;
        is_int = (v64 == d);
    } else
#ifdef CONFIG_BIGNUM
    if (tag == JS_TAG_BIG_INT) {
        JSBigFloat *p1 = JS_VALUE_GET_PTR(argv[0]);
        
        if (p->class_id == JS_CLASS_BIG_INT64_ARRAY) {
            if (bf_get_int64(&v64, &p1->num, 0) != 0)
                goto done;
        } else if (p->class_id == JS_CLASS_BIG_UINT64_ARRAY) {
            if (bf_get_uint64((uint64_t *)&v64, &p1->num) != 0)
                goto done;
        } else {
            goto done;
        }
        d = 0;
        is_bigint = 1;
    } else
#endif
    {
        goto done;
    }

    switch (p->class_id) {
    case JS_CLASS_INT8_ARRAY:
        if (is_int && (int8_t)v64 == v64)
            goto scan8;
        break;
    case JS_CLASS_UINT8C_ARRAY:
    case JS_CLASS_UINT8_ARRAY:
        if (is_int && (uint8_t)v64 == v64) {
            const uint8_t *pv, *pp;
            uint16_t v;
        scan8:
            pv = p->u.array.u.uint8_ptr;
            v = v64;
            if (inc > 0) {
                pp = memchr(pv + k, v, len - k);
                if (pp)
                    res = pp - pv;
            } else {
                for (; k != stop; k += inc) {
                    if (pv[k] == v) {
                        res = k;
                        break;
                    }
                }
            }
        }
        break;
    case JS_CLASS_INT16_ARRAY:
        if (is_int && (int16_t)v64 == v64)
            goto scan16;
        break;
    case JS_CLASS_UINT16_ARRAY:
        if (is_int && (uint16_t)v64 == v64) {
            const uint16_t *pv;
            uint16_t v;
        scan16:
            pv = p->u.array.u.uint16_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_INT32_ARRAY:
        if (is_int && (int32_t)v64 == v64)
            goto scan32;
        break;
    case JS_CLASS_UINT32_ARRAY:
        if (is_int && (uint32_t)v64 == v64) {
            const uint32_t *pv;
            uint32_t v;
        scan32:
            pv = p->u.array.u.uint32_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_FLOAT32_ARRAY:
        if (is_bigint)
            break;
        if (isnan(d)) {
            const float *pv = p->u.array.u.float_ptr;
            /* special case: indexOf returns -1, includes finds NaN */
            if (special != special_includes)
                goto done;
            for (; k != stop; k += inc) {
                if (isnan(pv[k])) {
                    res = k;
                    break;
                }
            }
        } else if ((f = (float)d) == d) {
            const float *pv = p->u.array.u.float_ptr;
            for (; k != stop; k += inc) {
                if (pv[k] == f) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_FLOAT64_ARRAY:
        if (is_bigint)
            break;
        if (isnan(d)) {
            const double *pv = p->u.array.u.double_ptr;
            /* special case: indexOf returns -1, includes finds NaN */
            if (special != special_includes)
                goto done;
            for (; k != stop; k += inc) {
                if (isnan(pv[k])) {
                    res = k;
                    break;
                }
            }
        } else {
            const double *pv = p->u.array.u.double_ptr;
            for (; k != stop; k += inc) {
                if (pv[k] == d) {
                    res = k;
                    break;
                }
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_CLASS_BIG_INT64_ARRAY:
        if (is_bigint || (is_math_mode(ctx) && is_int &&
                          v64 >= -MAX_SAFE_INTEGER &&
                          v64 <= MAX_SAFE_INTEGER)) {
            goto scan64;
        }
        break;
    case JS_CLASS_BIG_UINT64_ARRAY:
        if (is_bigint || (is_math_mode(ctx) && is_int &&
                          v64 >= 0 && v64 <= MAX_SAFE_INTEGER)) {
            const uint64_t *pv;
            uint64_t v;
        scan64:
            pv = p->u.array.u.uint64_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
#endif
    }

done:
    if (special == special_includes)
        return JS_NewBool(ctx, res >= 0);
    else
        return JS_NewInt32(ctx, res);

exception:
    return JS_EXCEPTION;
}